

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O3

void __thiscall AngleSet::set(AngleSet *this,double sTheta,double eTheta)

{
  if (eTheta <= sTheta) {
    _set(this,sTheta,6.283185307179586);
    sTheta = 0.0;
  }
  _set(this,sTheta,eTheta);
  return;
}

Assistant:

void AngleSet::set(double sTheta, double eTheta)
{
	if (eTheta > sTheta) {
		_set(sTheta, eTheta);

	}
	else {
		_set(sTheta, TWOPI);
		_set(0, eTheta);
	} //end-else
}